

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

void __thiscall
snmalloc::MessageBuilder<1024UL>::append(MessageBuilder<1024UL> *this,unsigned_long_long s)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  char cStack_19;
  Array<char,_16> buf;
  
  uVar2 = this->insert;
  if (uVar2 < 0x3ff) {
    this->insert = uVar2 + 1;
    (this->buffer)._M_elems[uVar2] = '0';
  }
  uVar2 = this->insert;
  if (uVar2 < 0x3ff) {
    this->insert = uVar2 + 1;
    (this->buffer)._M_elems[uVar2] = 'x';
  }
  buf._M_elems[0] = '\0';
  buf._M_elems[1] = '\0';
  buf._M_elems[2] = '\0';
  buf._M_elems[3] = '\0';
  buf._M_elems[4] = '\0';
  buf._M_elems[5] = '\0';
  buf._M_elems[6] = '\0';
  buf._M_elems[7] = '\0';
  buf._M_elems[8] = '\0';
  buf._M_elems[9] = '\0';
  buf._M_elems[10] = '\0';
  buf._M_elems[0xb] = '\0';
  buf._M_elems[0xc] = '\0';
  buf._M_elems[0xd] = '\0';
  buf._M_elems[0xe] = '\0';
  buf._M_elems[0xf] = '\0';
  lVar5 = 0x10;
  do {
    buf._M_elems[lVar5 + -1] = "0123456789abcdef"[(uint)s & 0xf];
    s = s >> 4;
    lVar4 = lVar5 + -1;
    bVar3 = 0 < lVar5;
    lVar5 = lVar4;
  } while (lVar4 != 0 && bVar3);
  bVar3 = true;
  lVar5 = 0;
  do {
    cVar1 = buf._M_elems[lVar5];
    if (!(bool)(bVar3 & cVar1 == '0')) {
      uVar2 = this->insert;
      if (uVar2 < 0x3ff) {
        this->insert = uVar2 + 1;
        (this->buffer)._M_elems[uVar2] = cVar1;
      }
      bVar3 = false;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  if ((bVar3) && (uVar2 = this->insert, uVar2 < 0x3ff)) {
    this->insert = uVar2 + 1;
    (this->buffer)._M_elems[uVar2] = '0';
  }
  return;
}

Assistant:

void append_char(char c)
    {
      if (insert < SafeLength)
      {
        buffer[insert++] = c;
      }
    }